

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::Swap(CGraphics_Threaded *this)

{
  long lVar1;
  int iVar2;
  CGraphics_Threaded *in_RDI;
  long in_FS_OFFSET;
  CSwapCommand Cmd;
  CGraphics_Threaded *this_00;
  char *in_stack_ffffffffffffffe0;
  CGraphics_Threaded *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if ((in_RDI->m_DoScreenshot & 1U) != 0) {
    iVar2 = (**(code **)(*(long *)in_RDI + 0x1a0))();
    if (iVar2 != 0) {
      ScreenshotDirect(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    }
    in_RDI->m_DoScreenshot = false;
  }
  CCommandBuffer::CSwapCommand::CSwapCommand((CSwapCommand *)0x13177f);
  CCommandBuffer::AddCommand<CCommandBuffer::CSwapCommand>
            ((CCommandBuffer *)this_00,(CSwapCommand *)in_RDI);
  KickCommandBuffer(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::Swap()
{
	// TODO: screenshot support
	if(m_DoScreenshot)
	{
		if(WindowActive())
			ScreenshotDirect(m_aScreenshotName);
		m_DoScreenshot = false;
	}

	// add swap command
	CCommandBuffer::CSwapCommand Cmd;
	Cmd.m_Finish = m_pConfig->m_GfxFinish;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the command buffer
	KickCommandBuffer();
}